

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O1

void __thiscall
crnlib::
hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
::rehash(hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
         *this,uint new_hash_size)

{
  undefined4 uVar1;
  void *p;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ulong uVar34;
  ulong uVar35;
  raw_node *prVar36;
  uint8 *puVar37;
  raw_node *prVar38;
  raw_node *prVar39;
  uint uVar40;
  ulong uVar41;
  uint uVar42;
  uint uVar43;
  long lVar44;
  undefined1 auVar45 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar65;
  int iVar68;
  int iVar69;
  undefined1 auVar66 [16];
  int iVar70;
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar84;
  int iVar88;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
  local_48;
  
  if ((this->m_num_valid <= new_hash_size) &&
     (uVar35 = (ulong)new_hash_size, (this->m_values).m_size != new_hash_size)) {
    local_48.m_values.m_p = (raw_node *)0x0;
    local_48.m_values.m_size = 0;
    local_48.m_values.m_capacity = 0;
    local_48.m_hash_shift = 0x20;
    local_48.m_num_valid = 0;
    local_48.m_grow_threshold = 0;
    uVar40 = -new_hash_size;
    if (uVar40 != 0) {
      if (new_hash_size != 0 || uVar40 == 0) {
        if (new_hash_size != 0) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_48,new_hash_size,new_hash_size == 1,0x20,
                     vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
                     ::object_mover,false);
        }
        auVar33 = _DAT_001b10b0;
        auVar32 = _DAT_001b10a0;
        auVar31 = _DAT_001b1090;
        auVar30 = _DAT_001b1080;
        auVar29 = _DAT_001b1070;
        auVar28 = _DAT_001b1060;
        auVar27 = _DAT_001b1050;
        if (local_48.m_values.m_size != new_hash_size) {
          uVar34 = (ulong)(new_hash_size - local_48.m_values.m_size) + 0x7ffffffffffffff;
          uVar41 = uVar34 & 0x7ffffffffffffff;
          auVar45._8_4_ = (int)uVar41;
          auVar45._0_8_ = uVar41;
          auVar45._12_4_ = (int)(uVar41 >> 0x20);
          puVar37 = local_48.m_values.m_p[(ulong)local_48.m_values.m_size + 0xf].m_bits + 0x1c;
          lVar44 = 0;
          do {
            auVar63._8_4_ = (int)lVar44;
            auVar63._0_8_ = lVar44;
            auVar63._12_4_ = (int)((ulong)lVar44 >> 0x20);
            auVar66 = auVar45 ^ auVar33;
            auVar71 = (auVar63 | auVar32) ^ auVar33;
            iVar65 = auVar66._0_4_;
            iVar84 = -(uint)(iVar65 < auVar71._0_4_);
            iVar68 = auVar66._4_4_;
            auVar73._4_4_ = -(uint)(iVar68 < auVar71._4_4_);
            iVar69 = auVar66._8_4_;
            iVar88 = -(uint)(iVar69 < auVar71._8_4_);
            iVar70 = auVar66._12_4_;
            auVar73._12_4_ = -(uint)(iVar70 < auVar71._12_4_);
            auVar46._4_4_ = iVar84;
            auVar46._0_4_ = iVar84;
            auVar46._8_4_ = iVar88;
            auVar46._12_4_ = iVar88;
            auVar46 = pshuflw(in_XMM1,auVar46,0xe8);
            auVar72._4_4_ = -(uint)(auVar71._4_4_ == iVar68);
            auVar72._12_4_ = -(uint)(auVar71._12_4_ == iVar70);
            auVar72._0_4_ = auVar72._4_4_;
            auVar72._8_4_ = auVar72._12_4_;
            auVar55 = pshuflw(in_XMM2,auVar72,0xe8);
            auVar73._0_4_ = auVar73._4_4_;
            auVar73._8_4_ = auVar73._12_4_;
            auVar71 = pshuflw(auVar46,auVar73,0xe8);
            auVar66._8_4_ = 0xffffffff;
            auVar66._0_8_ = 0xffffffffffffffff;
            auVar66._12_4_ = 0xffffffff;
            auVar66 = (auVar71 | auVar55 & auVar46) ^ auVar66;
            auVar66 = packssdw(auVar66,auVar66);
            if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar37[-0x1e0] = 0;
            }
            auVar55._4_4_ = iVar84;
            auVar55._0_4_ = iVar84;
            auVar55._8_4_ = iVar88;
            auVar55._12_4_ = iVar88;
            auVar73 = auVar72 & auVar55 | auVar73;
            auVar66 = packssdw(auVar73,auVar73);
            auVar71._8_4_ = 0xffffffff;
            auVar71._0_8_ = 0xffffffffffffffff;
            auVar71._12_4_ = 0xffffffff;
            auVar66 = packssdw(auVar66 ^ auVar71,auVar66 ^ auVar71);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66._0_4_ >> 8 & 1) != 0) {
              puVar37[-0x1c0] = 0;
            }
            auVar66 = (auVar63 | auVar31) ^ auVar33;
            auVar56._0_4_ = -(uint)(iVar65 < auVar66._0_4_);
            auVar56._4_4_ = -(uint)(iVar68 < auVar66._4_4_);
            auVar56._8_4_ = -(uint)(iVar69 < auVar66._8_4_);
            auVar56._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
            auVar74._4_4_ = auVar56._0_4_;
            auVar74._0_4_ = auVar56._0_4_;
            auVar74._8_4_ = auVar56._8_4_;
            auVar74._12_4_ = auVar56._8_4_;
            iVar84 = -(uint)(auVar66._4_4_ == iVar68);
            iVar88 = -(uint)(auVar66._12_4_ == iVar70);
            auVar12._4_4_ = iVar84;
            auVar12._0_4_ = iVar84;
            auVar12._8_4_ = iVar88;
            auVar12._12_4_ = iVar88;
            auVar85._4_4_ = auVar56._4_4_;
            auVar85._0_4_ = auVar56._4_4_;
            auVar85._8_4_ = auVar56._12_4_;
            auVar85._12_4_ = auVar56._12_4_;
            auVar66 = auVar12 & auVar74 | auVar85;
            auVar66 = packssdw(auVar66,auVar66);
            auVar3._8_4_ = 0xffffffff;
            auVar3._0_8_ = 0xffffffffffffffff;
            auVar3._12_4_ = 0xffffffff;
            auVar66 = packssdw(auVar66 ^ auVar3,auVar66 ^ auVar3);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66._0_4_ >> 0x10 & 1) != 0) {
              puVar37[-0x1a0] = 0;
            }
            auVar66 = pshufhw(auVar66,auVar74,0x84);
            auVar13._4_4_ = iVar84;
            auVar13._0_4_ = iVar84;
            auVar13._8_4_ = iVar88;
            auVar13._12_4_ = iVar88;
            auVar71 = pshufhw(auVar56,auVar13,0x84);
            auVar46 = pshufhw(auVar66,auVar85,0x84);
            auVar47._8_4_ = 0xffffffff;
            auVar47._0_8_ = 0xffffffffffffffff;
            auVar47._12_4_ = 0xffffffff;
            auVar47 = (auVar46 | auVar71 & auVar66) ^ auVar47;
            auVar66 = packssdw(auVar47,auVar47);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66._0_4_ >> 0x18 & 1) != 0) {
              puVar37[-0x180] = 0;
            }
            auVar66 = (auVar63 | auVar30) ^ auVar33;
            auVar57._0_4_ = -(uint)(iVar65 < auVar66._0_4_);
            auVar57._4_4_ = -(uint)(iVar68 < auVar66._4_4_);
            auVar57._8_4_ = -(uint)(iVar69 < auVar66._8_4_);
            auVar57._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
            auVar14._4_4_ = auVar57._0_4_;
            auVar14._0_4_ = auVar57._0_4_;
            auVar14._8_4_ = auVar57._8_4_;
            auVar14._12_4_ = auVar57._8_4_;
            auVar71 = pshuflw(auVar85,auVar14,0xe8);
            auVar48._0_4_ = -(uint)(auVar66._0_4_ == iVar65);
            auVar48._4_4_ = -(uint)(auVar66._4_4_ == iVar68);
            auVar48._8_4_ = -(uint)(auVar66._8_4_ == iVar69);
            auVar48._12_4_ = -(uint)(auVar66._12_4_ == iVar70);
            auVar75._4_4_ = auVar48._4_4_;
            auVar75._0_4_ = auVar48._4_4_;
            auVar75._8_4_ = auVar48._12_4_;
            auVar75._12_4_ = auVar48._12_4_;
            auVar66 = pshuflw(auVar48,auVar75,0xe8);
            auVar76._4_4_ = auVar57._4_4_;
            auVar76._0_4_ = auVar57._4_4_;
            auVar76._8_4_ = auVar57._12_4_;
            auVar76._12_4_ = auVar57._12_4_;
            auVar46 = pshuflw(auVar57,auVar76,0xe8);
            auVar4._8_4_ = 0xffffffff;
            auVar4._0_8_ = 0xffffffffffffffff;
            auVar4._12_4_ = 0xffffffff;
            auVar66 = packssdw(auVar66 & auVar71,(auVar46 | auVar66 & auVar71) ^ auVar4);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar37[-0x160] = 0;
            }
            auVar15._4_4_ = auVar57._0_4_;
            auVar15._0_4_ = auVar57._0_4_;
            auVar15._8_4_ = auVar57._8_4_;
            auVar15._12_4_ = auVar57._8_4_;
            auVar76 = auVar75 & auVar15 | auVar76;
            auVar46 = packssdw(auVar76,auVar76);
            auVar5._8_4_ = 0xffffffff;
            auVar5._0_8_ = 0xffffffffffffffff;
            auVar5._12_4_ = 0xffffffff;
            auVar66 = packssdw(auVar66,auVar46 ^ auVar5);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66._4_2_ >> 8 & 1) != 0) {
              puVar37[-0x140] = 0;
            }
            auVar66 = (auVar63 | auVar29) ^ auVar33;
            auVar58._0_4_ = -(uint)(iVar65 < auVar66._0_4_);
            auVar58._4_4_ = -(uint)(iVar68 < auVar66._4_4_);
            auVar58._8_4_ = -(uint)(iVar69 < auVar66._8_4_);
            auVar58._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
            auVar77._4_4_ = auVar58._0_4_;
            auVar77._0_4_ = auVar58._0_4_;
            auVar77._8_4_ = auVar58._8_4_;
            auVar77._12_4_ = auVar58._8_4_;
            iVar84 = -(uint)(auVar66._4_4_ == iVar68);
            iVar88 = -(uint)(auVar66._12_4_ == iVar70);
            auVar16._4_4_ = iVar84;
            auVar16._0_4_ = iVar84;
            auVar16._8_4_ = iVar88;
            auVar16._12_4_ = iVar88;
            auVar86._4_4_ = auVar58._4_4_;
            auVar86._0_4_ = auVar58._4_4_;
            auVar86._8_4_ = auVar58._12_4_;
            auVar86._12_4_ = auVar58._12_4_;
            auVar66 = auVar16 & auVar77 | auVar86;
            auVar66 = packssdw(auVar66,auVar66);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            auVar66 = packssdw(auVar66 ^ auVar6,auVar66 ^ auVar6);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar37[-0x120] = 0;
            }
            auVar66 = pshufhw(auVar66,auVar77,0x84);
            auVar17._4_4_ = iVar84;
            auVar17._0_4_ = iVar84;
            auVar17._8_4_ = iVar88;
            auVar17._12_4_ = iVar88;
            auVar71 = pshufhw(auVar58,auVar17,0x84);
            auVar46 = pshufhw(auVar66,auVar86,0x84);
            auVar49._8_4_ = 0xffffffff;
            auVar49._0_8_ = 0xffffffffffffffff;
            auVar49._12_4_ = 0xffffffff;
            auVar49 = (auVar46 | auVar71 & auVar66) ^ auVar49;
            auVar66 = packssdw(auVar49,auVar49);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66._6_2_ >> 8 & 1) != 0) {
              puVar37[-0x100] = 0;
            }
            auVar66 = (auVar63 | auVar28) ^ auVar33;
            auVar59._0_4_ = -(uint)(iVar65 < auVar66._0_4_);
            auVar59._4_4_ = -(uint)(iVar68 < auVar66._4_4_);
            auVar59._8_4_ = -(uint)(iVar69 < auVar66._8_4_);
            auVar59._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
            auVar18._4_4_ = auVar59._0_4_;
            auVar18._0_4_ = auVar59._0_4_;
            auVar18._8_4_ = auVar59._8_4_;
            auVar18._12_4_ = auVar59._8_4_;
            auVar71 = pshuflw(auVar86,auVar18,0xe8);
            auVar50._0_4_ = -(uint)(auVar66._0_4_ == iVar65);
            auVar50._4_4_ = -(uint)(auVar66._4_4_ == iVar68);
            auVar50._8_4_ = -(uint)(auVar66._8_4_ == iVar69);
            auVar50._12_4_ = -(uint)(auVar66._12_4_ == iVar70);
            auVar78._4_4_ = auVar50._4_4_;
            auVar78._0_4_ = auVar50._4_4_;
            auVar78._8_4_ = auVar50._12_4_;
            auVar78._12_4_ = auVar50._12_4_;
            auVar66 = pshuflw(auVar50,auVar78,0xe8);
            auVar79._4_4_ = auVar59._4_4_;
            auVar79._0_4_ = auVar59._4_4_;
            auVar79._8_4_ = auVar59._12_4_;
            auVar79._12_4_ = auVar59._12_4_;
            auVar46 = pshuflw(auVar59,auVar79,0xe8);
            auVar60._8_4_ = 0xffffffff;
            auVar60._0_8_ = 0xffffffffffffffff;
            auVar60._12_4_ = 0xffffffff;
            auVar60 = (auVar46 | auVar66 & auVar71) ^ auVar60;
            auVar46 = packssdw(auVar60,auVar60);
            auVar66 = packsswb(auVar66 & auVar71,auVar46);
            if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar37[-0xe0] = 0;
            }
            auVar19._4_4_ = auVar59._0_4_;
            auVar19._0_4_ = auVar59._0_4_;
            auVar19._8_4_ = auVar59._8_4_;
            auVar19._12_4_ = auVar59._8_4_;
            auVar79 = auVar78 & auVar19 | auVar79;
            auVar46 = packssdw(auVar79,auVar79);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            auVar46 = packssdw(auVar46 ^ auVar7,auVar46 ^ auVar7);
            auVar66 = packsswb(auVar66,auVar46);
            if ((auVar66._8_2_ >> 8 & 1) != 0) {
              puVar37[-0xc0] = 0;
            }
            auVar66 = (auVar63 | auVar27) ^ auVar33;
            auVar61._0_4_ = -(uint)(iVar65 < auVar66._0_4_);
            auVar61._4_4_ = -(uint)(iVar68 < auVar66._4_4_);
            auVar61._8_4_ = -(uint)(iVar69 < auVar66._8_4_);
            auVar61._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
            auVar80._4_4_ = auVar61._0_4_;
            auVar80._0_4_ = auVar61._0_4_;
            auVar80._8_4_ = auVar61._8_4_;
            auVar80._12_4_ = auVar61._8_4_;
            iVar84 = -(uint)(auVar66._4_4_ == iVar68);
            iVar88 = -(uint)(auVar66._12_4_ == iVar70);
            auVar20._4_4_ = iVar84;
            auVar20._0_4_ = iVar84;
            auVar20._8_4_ = iVar88;
            auVar20._12_4_ = iVar88;
            auVar87._4_4_ = auVar61._4_4_;
            auVar87._0_4_ = auVar61._4_4_;
            auVar87._8_4_ = auVar61._12_4_;
            auVar87._12_4_ = auVar61._12_4_;
            auVar66 = auVar20 & auVar80 | auVar87;
            auVar66 = packssdw(auVar66,auVar66);
            auVar8._8_4_ = 0xffffffff;
            auVar8._0_8_ = 0xffffffffffffffff;
            auVar8._12_4_ = 0xffffffff;
            auVar66 = packssdw(auVar66 ^ auVar8,auVar66 ^ auVar8);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              puVar37[-0xa0] = 0;
            }
            auVar66 = pshufhw(auVar66,auVar80,0x84);
            auVar21._4_4_ = iVar84;
            auVar21._0_4_ = iVar84;
            auVar21._8_4_ = iVar88;
            auVar21._12_4_ = iVar88;
            auVar71 = pshufhw(auVar61,auVar21,0x84);
            auVar46 = pshufhw(auVar66,auVar87,0x84);
            auVar51._8_4_ = 0xffffffff;
            auVar51._0_8_ = 0xffffffffffffffff;
            auVar51._12_4_ = 0xffffffff;
            auVar51 = (auVar46 | auVar71 & auVar66) ^ auVar51;
            auVar66 = packssdw(auVar51,auVar51);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66._10_2_ >> 8 & 1) != 0) {
              puVar37[-0x80] = 0;
            }
            auVar66 = (auVar63 | _DAT_001b1040) ^ auVar33;
            auVar62._0_4_ = -(uint)(iVar65 < auVar66._0_4_);
            auVar62._4_4_ = -(uint)(iVar68 < auVar66._4_4_);
            auVar62._8_4_ = -(uint)(iVar69 < auVar66._8_4_);
            auVar62._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
            auVar22._4_4_ = auVar62._0_4_;
            auVar22._0_4_ = auVar62._0_4_;
            auVar22._8_4_ = auVar62._8_4_;
            auVar22._12_4_ = auVar62._8_4_;
            auVar71 = pshuflw(auVar87,auVar22,0xe8);
            auVar52._0_4_ = -(uint)(auVar66._0_4_ == iVar65);
            auVar52._4_4_ = -(uint)(auVar66._4_4_ == iVar68);
            auVar52._8_4_ = -(uint)(auVar66._8_4_ == iVar69);
            auVar52._12_4_ = -(uint)(auVar66._12_4_ == iVar70);
            auVar81._4_4_ = auVar52._4_4_;
            auVar81._0_4_ = auVar52._4_4_;
            auVar81._8_4_ = auVar52._12_4_;
            auVar81._12_4_ = auVar52._12_4_;
            auVar66 = pshuflw(auVar52,auVar81,0xe8);
            auVar82._4_4_ = auVar62._4_4_;
            auVar82._0_4_ = auVar62._4_4_;
            auVar82._8_4_ = auVar62._12_4_;
            auVar82._12_4_ = auVar62._12_4_;
            auVar46 = pshuflw(auVar62,auVar82,0xe8);
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            auVar66 = packssdw(auVar66 & auVar71,(auVar46 | auVar66 & auVar71) ^ auVar9);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar37[-0x60] = 0;
            }
            auVar23._4_4_ = auVar62._0_4_;
            auVar23._0_4_ = auVar62._0_4_;
            auVar23._8_4_ = auVar62._8_4_;
            auVar23._12_4_ = auVar62._8_4_;
            auVar82 = auVar81 & auVar23 | auVar82;
            auVar46 = packssdw(auVar82,auVar82);
            auVar10._8_4_ = 0xffffffff;
            auVar10._0_8_ = 0xffffffffffffffff;
            auVar10._12_4_ = 0xffffffff;
            auVar66 = packssdw(auVar66,auVar46 ^ auVar10);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66._12_2_ >> 8 & 1) != 0) {
              puVar37[-0x40] = 0;
            }
            auVar66 = (auVar63 | _DAT_001b1030) ^ auVar33;
            auVar53._0_4_ = -(uint)(iVar65 < auVar66._0_4_);
            auVar53._4_4_ = -(uint)(iVar68 < auVar66._4_4_);
            auVar53._8_4_ = -(uint)(iVar69 < auVar66._8_4_);
            auVar53._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
            auVar83._4_4_ = auVar53._0_4_;
            auVar83._0_4_ = auVar53._0_4_;
            auVar83._8_4_ = auVar53._8_4_;
            auVar83._12_4_ = auVar53._8_4_;
            auVar64._4_4_ = -(uint)(auVar66._4_4_ == iVar68);
            auVar64._12_4_ = -(uint)(auVar66._12_4_ == iVar70);
            auVar64._0_4_ = auVar64._4_4_;
            auVar64._8_4_ = auVar64._12_4_;
            auVar67._4_4_ = auVar53._4_4_;
            auVar67._0_4_ = auVar53._4_4_;
            auVar67._8_4_ = auVar53._12_4_;
            auVar67._12_4_ = auVar53._12_4_;
            auVar46 = auVar64 & auVar83 | auVar67;
            auVar66 = packssdw(auVar53,auVar46);
            auVar11._8_4_ = 0xffffffff;
            auVar11._0_8_ = 0xffffffffffffffff;
            auVar11._12_4_ = 0xffffffff;
            auVar66 = packssdw(auVar66 ^ auVar11,auVar66 ^ auVar11);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar37[-0x20] = 0;
            }
            auVar66 = pshufhw(auVar66,auVar83,0x84);
            auVar46 = pshufhw(auVar46,auVar64,0x84);
            in_XMM2 = auVar46 & auVar66;
            auVar66 = pshufhw(auVar66,auVar67,0x84);
            auVar54._8_4_ = 0xffffffff;
            auVar54._0_8_ = 0xffffffffffffffff;
            auVar54._12_4_ = 0xffffffff;
            auVar54 = (auVar66 | in_XMM2) ^ auVar54;
            auVar66 = packssdw(auVar54,auVar54);
            in_XMM1 = packsswb(auVar66,auVar66);
            if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
              *puVar37 = '\0';
            }
            lVar44 = lVar44 + 0x10;
            puVar37 = puVar37 + 0x200;
          } while ((uVar41 - ((uint)uVar34 & 0xf)) + 0x10 != lVar44);
        }
      }
      else {
        lVar44 = 0;
        do {
          if ((*(char *)(uVar35 * 0x20 + 0x1c + lVar44) != '\0') &&
             (p = *(void **)(uVar35 * 0x20 + lVar44), p != (void *)0x0)) {
            crnlib_free(p);
          }
          lVar44 = lVar44 + 0x20;
        } while ((ulong)uVar40 << 5 != lVar44);
      }
      local_48.m_values.m_size = new_hash_size;
    }
    uVar24 = local_48._24_8_;
    local_48.m_hash_shift = 0x20;
    if (1 < new_hash_size) {
      do {
        local_48.m_hash_shift = local_48.m_hash_shift - 1;
        uVar40 = (uint)uVar35;
        uVar35 = uVar35 >> 1;
      } while (3 < uVar40);
    }
    local_48._24_8_ = local_48._24_8_ & 0xffffffff;
    uVar25 = local_48._24_8_;
    local_48.m_num_valid = (uint)uVar24;
    uVar35 = (ulong)(this->m_values).m_size;
    if (uVar35 != 0) {
      prVar39 = (this->m_values).m_p;
      prVar36 = prVar39 + uVar35;
      local_48._24_8_ = uVar25;
      do {
        if (prVar39->m_bits[0x1c] != '\0') {
          uVar40 = (uint)(*(int *)(prVar39->m_bits + 0x10) * -0x61c88647) >>
                   ((byte)local_48.m_hash_shift & 0x1f);
          prVar38 = local_48.m_values.m_p + uVar40;
          if (local_48.m_values.m_p[uVar40].m_bits[0x1c] != '\0') {
            uVar43 = uVar40;
            do {
              uVar42 = uVar43 - 1;
              if (uVar43 == 0) {
                uVar42 = local_48.m_values.m_size - 1;
              }
              if (uVar42 == uVar40) goto LAB_00149804;
              prVar38 = prVar38 + -1;
              if (uVar43 == 0) {
                prVar38 = local_48.m_values.m_p + (local_48.m_values.m_size - 1);
              }
              uVar43 = uVar42;
            } while (prVar38->m_bits[0x1c] != '\0');
          }
          uVar24 = *(undefined8 *)prVar39->m_bits;
          uVar25 = *(undefined8 *)(prVar39->m_bits + 8);
          uVar26 = *(undefined8 *)(prVar39->m_bits + 0x18);
          *(undefined8 *)(prVar38->m_bits + 0x10) = *(undefined8 *)(prVar39->m_bits + 0x10);
          *(undefined8 *)(prVar38->m_bits + 0x18) = uVar26;
          *(undefined8 *)prVar38->m_bits = uVar24;
          *(undefined8 *)(prVar38->m_bits + 8) = uVar25;
          prVar39->m_bits[0x1c] = '\0';
          local_48.m_grow_threshold = 0;
          local_48.m_num_valid = local_48.m_num_valid + 1;
LAB_00149804:
          if (local_48.m_num_valid == this->m_num_valid) break;
        }
        prVar39 = prVar39 + 1;
      } while (prVar39 != prVar36);
    }
    local_48.m_grow_threshold = new_hash_size + 1 >> 1;
    prVar39 = (this->m_values).m_p;
    if (prVar39 != (raw_node *)0x0) {
      crnlib_free(prVar39);
      (this->m_values).m_p = (raw_node *)0x0;
      (this->m_values).m_size = 0;
      (this->m_values).m_capacity = 0;
    }
    this->m_hash_shift = 0x20;
    prVar39 = (this->m_values).m_p;
    (this->m_values).m_p = local_48.m_values.m_p;
    uVar24 = local_48.m_values._8_8_;
    uVar1 = (this->m_values).m_size;
    uVar2 = (this->m_values).m_capacity;
    local_48.m_values.m_capacity = uVar2;
    local_48.m_values.m_size = uVar1;
    uVar25 = local_48.m_values._8_8_;
    local_48.m_values.m_size = (uint)uVar24;
    local_48.m_values.m_capacity = SUB84(uVar24,4);
    (this->m_values).m_size = local_48.m_values.m_size;
    (this->m_values).m_capacity = local_48.m_values.m_capacity;
    local_48.m_values.m_p = prVar39;
    local_48.m_values = (node_vector)CONCAT88(uVar25,local_48.m_values.m_p);
    this->m_hash_shift = local_48.m_hash_shift;
    local_48.m_hash_shift = 0x20;
    uVar24._0_4_ = this->m_num_valid;
    uVar24._4_4_ = this->m_grow_threshold;
    this->m_num_valid = local_48.m_num_valid;
    this->m_grow_threshold = local_48.m_grow_threshold;
    local_48._24_8_ = uVar24;
    ~hash_map(&local_48);
  }
  return;
}

Assistant:

inline void rehash(uint new_hash_size) {
    CRNLIB_ASSERT(new_hash_size >= m_num_valid);
    CRNLIB_ASSERT(math::is_power_of_2(new_hash_size));

    if ((new_hash_size < m_num_valid) || (new_hash_size == m_values.size()))
      return;

    hash_map new_map;
    new_map.m_values.resize(new_hash_size);
    new_map.m_hash_shift = 32U - math::floor_log2i(new_hash_size);
    CRNLIB_ASSERT(new_hash_size == (1U << (32U - new_map.m_hash_shift)));
    new_map.m_grow_threshold = UINT_MAX;

    node* pNode = reinterpret_cast<node*>(m_values.begin());
    node* pNode_end = pNode + m_values.size();

    while (pNode != pNode_end) {
      if (pNode->state) {
        new_map.move_into(pNode);

        if (new_map.m_num_valid == m_num_valid)
          break;
      }

      pNode++;
    }

    new_map.m_grow_threshold = (new_hash_size + 1U) >> 1U;

    m_values.clear_no_destruction();
    m_hash_shift = 32;

    swap(new_map);
  }